

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void dg::vr::RelationsAnalyzer::inferFromPreds
               (VRLocation *location,Handle lt,Relations known,Handle rt)

{
  Value *pVVar1;
  _Link_type p_Var2;
  pointer ppVVar3;
  VRLocation *pVVar4;
  VectorSet<const_llvm::Value_*> *pVVar5;
  _Base_bitset<1UL> _Var6;
  _Link_type p_Var7;
  pointer ppVVar8;
  _Link_type p_Var9;
  _Link_type p_Var10;
  pointer ppVVar11;
  ValueRelations *this;
  size_t rtId;
  size_t ltId;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  setEqual;
  Value *local_a8;
  Value *local_a0;
  ValueRelations *local_98;
  VRLocation *local_90;
  _Base_bitset<1UL> local_88;
  Handle local_80;
  ValueRelations *local_78;
  Handle local_70;
  pointer local_68;
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  local_60;
  
  local_88._M_w = (_WordT)known.bits.super__Base_bitset<1UL>._M_w;
  pVVar4 = VRLocation::getTreePredecessor(location);
  this = &pVVar4->relations;
  local_98 = &location->relations;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = location;
  local_80 = lt;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar5 = ValueRelations::getEqual(this,lt);
  ppVVar8 = (pVVar5->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (pVVar5->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppVVar8 != local_68) {
    local_78 = this;
    local_70 = rt;
    do {
      local_a0 = *ppVVar8;
      if ((_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Link_type)0x0)
      {
LAB_0011efd8:
        pVVar5 = ValueRelations::getEqual(this,rt);
        ppVVar3 = (pVVar5->vec).
                  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppVVar11 = (pVVar5->vec).
                        super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; rt = local_70, this = local_78,
            ppVVar11 != ppVVar3; ppVVar11 = ppVVar11 + 1) {
          local_a8 = *ppVVar11;
          if (local_a0 != local_a8) {
            _Var6._M_w = (_WordT)getCommon<llvm::Value_const*,llvm::Value_const*>
                                           (local_90,&local_a0,local_88._M_w,&local_a8);
            if ((_Base_bitset<1UL>)_Var6._M_w != (_Base_bitset<1UL>)0x0) {
              if ((_Var6._M_w & 1) != 0) {
                std::
                _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                ::_M_emplace_unique<llvm::Value_const*&>
                          ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                            *)&local_60,&local_a8);
              }
              ValueRelations::set<llvm::Value_const*,llvm::Value_const*>
                        (local_98,&local_a0,(Relations)_Var6._M_w,&local_a8);
            }
          }
        }
        local_a8 = (Value *)ValueRelations::getBorderId(local_78,local_70);
        if (local_a8 != (Value *)0xffffffffffffffff) {
          _Var6._M_w = (_WordT)getCommon<llvm::Value_const*,unsigned_long>
                                         (local_90,&local_a0,local_88._M_w,
                                          (unsigned_long *)&local_a8);
          if ((_Base_bitset<1UL>)_Var6._M_w != (_Base_bitset<1UL>)0x0) {
            ValueRelations::set<llvm::Value_const*,unsigned_long>
                      (local_98,&local_a0,(Relations)_Var6._M_w,(unsigned_long *)&local_a8);
          }
        }
      }
      else {
        p_Var2 = (_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = (_Link_type)&local_60._M_impl.super__Rb_tree_header;
        do {
          p_Var9 = p_Var10;
          p_Var7 = p_Var2;
          pVVar1 = *(Value **)(p_Var7->_M_storage)._M_storage;
          p_Var10 = p_Var7;
          if (pVVar1 < local_a0) {
            p_Var10 = p_Var9;
          }
          p_Var2 = *(_Link_type *)(&p_Var7->_M_storage)[(ulong)(pVVar1 < local_a0) - 2]._M_storage;
        } while (p_Var2 != (_Link_type)0x0);
        if ((_Rb_tree_header *)p_Var10 == &local_60._M_impl.super__Rb_tree_header)
        goto LAB_0011efd8;
        if (pVVar1 < local_a0) {
          p_Var7 = p_Var9;
        }
        if (local_a0 < *(Value **)(p_Var7->_M_storage)._M_storage) goto LAB_0011efd8;
      }
      ppVVar8 = ppVVar8 + 1;
    } while (ppVVar8 != local_68);
  }
  local_a0 = (Value *)ValueRelations::getBorderId(this,local_80);
  if (local_a0 != (Value *)0xffffffffffffffff) {
    pVVar5 = ValueRelations::getEqual(this,rt);
    ppVVar8 = (pVVar5->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar11 = (pVVar5->vec).
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppVVar8 != ppVVar11) {
      do {
        local_a8 = *ppVVar8;
        _Var6._M_w = (_WordT)getCommon<unsigned_long,llvm::Value_const*>
                                       (local_90,(unsigned_long *)&local_a0,local_88._M_w,&local_a8)
        ;
        if ((_Base_bitset<1UL>)_Var6._M_w != (_Base_bitset<1UL>)0x0) {
          ValueRelations::set<unsigned_long,llvm::Value_const*>
                    (local_98,(unsigned_long *)&local_a0,(Relations)_Var6._M_w,&local_a8);
        }
        ppVVar8 = ppVVar8 + 1;
      } while (ppVVar8 != ppVVar11);
    }
    local_a8 = (Value *)ValueRelations::getBorderId(this,rt);
    if (local_a8 != (Value *)0xffffffffffffffff) {
      _Var6._M_w = (_WordT)getCommon<unsigned_long,unsigned_long>
                                     (local_90,(unsigned_long *)&local_a0,local_88._M_w,
                                      (unsigned_long *)&local_a8);
      if ((_Base_bitset<1UL>)_Var6._M_w != (_Base_bitset<1UL>)0x0) {
        ValueRelations::set<unsigned_long,unsigned_long>
                  (local_98,(unsigned_long *)&local_a0,(Relations)_Var6._M_w,
                   (unsigned_long *)&local_a8);
      }
    }
  }
  std::
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RelationsAnalyzer::inferFromPreds(VRLocation &location, Handle lt,
                                       Relations known, Handle rt) {
    const ValueRelations &predGraph = location.getTreePredecessor().relations;
    ValueRelations &newGraph = location.relations;

    std::set<V> setEqual;
    for (const auto *ltVal : predGraph.getEqual(lt)) {
        if (setEqual.find(ltVal) != setEqual.end())
            continue;
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            if (ltVal == rtVal)
                continue;

            Relations related = getCommon(location, ltVal, known, rtVal);
            if (!related.any())
                continue;

            if (related.has(Relations::EQ))
                setEqual.emplace(rtVal);
            newGraph.set(ltVal, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltVal, known, rtId);
            if (!related.any())
                continue;

            newGraph.set(ltVal, related, rtId);
        }
    }

    size_t ltId = predGraph.getBorderId(lt);
    if (ltId != std::string::npos) {
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            Relations related = getCommon(location, ltId, known, rtVal);
            if (!related.any())
                continue;

            newGraph.set(ltId, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltId, known, rtId);
            if (!related.any())
                return;

            newGraph.set(ltId, related, rtId);
        }
    }
}